

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

Float __thiscall pbrt::MIPMap::Bilerp<float>(MIPMap *this,int level,Point2f st)

{
  Image *this_00;
  Image *pIVar1;
  ulong uVar2;
  int c;
  Float FVar3;
  array<pbrt::WrapMode,_2> local_58;
  WrapMode2D local_50;
  array<pbrt::WrapMode,_2> local_48;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_40;
  
  if ((level < 0) || (uVar2 = (ulong)(uint)level, (this->pyramid).nStored <= uVar2)) {
    LogFatal<char_const(&)[37]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
               ,0x182,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
  }
  pIVar1 = (this->pyramid).ptr;
  this_00 = pIVar1 + uVar2;
  local_40.alloc.memoryResource._0_4_ = (int)pIVar1[uVar2].channelNames.nStored;
  if ((int)local_40.alloc.memoryResource == 4) {
    WrapMode2D::WrapMode2D((WrapMode2D *)&local_58,this->wrapMode);
    c = 3;
    local_48.values = local_58.values;
  }
  else {
    if ((int)local_40.alloc.memoryResource == 3) {
      WrapMode2D::WrapMode2D(&local_50,this->wrapMode);
      Image::Bilerp((ImageChannelValues *)&local_40,this_00,st,local_50);
      FVar3 = ImageChannelValues::Average((ImageChannelValues *)&local_40);
      InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector(&local_40);
      return FVar3;
    }
    if ((int)local_40.alloc.memoryResource != 1) {
      LogFatal<int>(Fatal,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                    ,0x18c,"Unexpected number of image channels: %d",(int *)&local_40);
    }
    WrapMode2D::WrapMode2D((WrapMode2D *)&local_48,this->wrapMode);
    c = 0;
  }
  FVar3 = Image::BilerpChannel(this_00,st,c,(WrapMode2D)local_48.values);
  return FVar3;
}

Assistant:

Float MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    switch (pyramid[level].NChannels()) {
    case 1:
        return pyramid[level].BilerpChannel(st, 0, wrapMode);
    case 3:
        return pyramid[level].Bilerp(st, wrapMode).Average();
    case 4:
        // Return alpha
        return pyramid[level].BilerpChannel(st, 3, wrapMode);
    default:
        LOG_FATAL("Unexpected number of image channels: %d", pyramid[level].NChannels());
    }
}